

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DistanceGraph.cc
# Opt level: O0

unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_> * __thiscall
DistanceGraph::get_connected_nodes(DistanceGraph *this)

{
  bool bVar1;
  value_type *__x;
  value_type *pvVar2;
  long in_RSI;
  unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_> *in_RDI;
  pair<std::__detail::_Node_iterator<long,_true,_false>,_bool> pVar3;
  int n;
  unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_> r;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  _Node_iterator_base<long,_false> in_stack_ffffffffffffff60;
  unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_> *this_00;
  undefined4 local_4c;
  
  this_00 = in_RDI;
  std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>::
  unordered_set((unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_> *)
                0x39026b);
  local_4c = 1;
  while( true ) {
    __x = (value_type *)(long)local_4c;
    pvVar2 = (value_type *)
             std::
             vector<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
             ::size((vector<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
                     *)(in_RSI + 8));
    if (pvVar2 <= __x) break;
    std::
    vector<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
    ::operator[]((vector<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
                  *)(in_RSI + 8),(long)local_4c);
    bVar1 = std::vector<Link,_std::allocator<Link>_>::empty
                      ((vector<Link,_std::allocator<Link>_> *)this_00);
    if (!bVar1) {
      pVar3 = std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>
              ::insert(this_00,__x);
      in_stack_ffffffffffffff60._M_cur =
           (__node_type *)pVar3.first.super__Node_iterator_base<long,_false>._M_cur;
      in_stack_ffffffffffffff5f = pVar3.second;
    }
    local_4c = local_4c + 1;
  }
  std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>::
  unordered_set((unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_> *)
                in_stack_ffffffffffffff60._M_cur,
                (unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_> *)
                CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
  std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>::
  ~unordered_set((unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_> *
                 )0x390338);
  return in_RDI;
}

Assistant:

std::unordered_set<sgNodeID_t> DistanceGraph::get_connected_nodes() const {
    std::unordered_set<sgNodeID_t> r;
    for (auto n=1;n<links.size();++n) if (!links[n].empty()) r.insert(n);
    return std::move(r);
}